

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O3

void __thiscall
nuraft::peer::peer(peer *this,ptr<srv_config> *config,context *ctx,executor *hb_exec,
                  ptr<logger> *logger)

{
  int32 iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  int iVar5;
  undefined1 local_49;
  timer_task<int> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  timer_task_type local_38;
  int32 local_34;
  
  (this->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->scheduler_).super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ctx->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (ctx->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->scheduler_).super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  peVar4 = (ctx->rpc_cli_factory_).
           super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar4->_vptr_rpc_client_factory[2])
            (&this->rpc_,peVar4,
             &((config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->endpoint_);
  *(undefined8 *)((long)&(this->rpc_protector_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->rpc_protector_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rpc_protector_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rpc_protector_).super___mutex_base._M_mutex + 8) = 0;
  (this->rpc_protector_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  context::get_params((context *)&stack0xffffffffffffffb8);
  (this->current_hb_interval_).super___atomic_base<int>._M_i =
       *(__int_type_conflict1 *)&(local_48->super_delayed_task).cancelled_;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  context::get_params((context *)&stack0xffffffffffffffb8);
  iVar1 = *(int32 *)&(local_48->super_delayed_task).cancelled_;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  this->hb_interval_ = iVar1;
  context::get_params((context *)&stack0xffffffffffffffb8);
  iVar1 = *(int32 *)&(local_48->super_delayed_task).field_0xc;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  this->rpc_backoff_ = iVar1;
  context::get_params((context *)&stack0xffffffffffffffb8);
  iVar2 = *(int *)&(local_48->super_delayed_task).cancelled_;
  iVar5 = *(int *)((long)&(local_48->super_delayed_task)._vptr_delayed_task + 4) - iVar2 / 2;
  if (iVar5 < iVar2) {
    iVar5 = iVar2;
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  this->max_hb_interval_ = iVar5;
  (this->next_log_idx_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->last_accepted_log_idx_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->next_batch_size_hint_in_bytes_).super___atomic_base<long>._M_i = 0;
  this->matched_idx_ = 0;
  *(undefined4 *)((long)&this->matched_idx_ + 7) = 0;
  local_34 = ((config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             id_;
  local_38 = heartbeat_timer;
  local_48 = (timer_task<int> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::timer_task<int>,std::allocator<nuraft::timer_task<int>>,std::function<void(int)>&,int,nuraft::timer_task_type>
            (&stack0xffffffffffffffc0,&stack0xffffffffffffffb8,
             (allocator<nuraft::timer_task<int>_> *)&local_49,hb_exec,&stack0xffffffffffffffcc,
             &stack0xffffffffffffffc8);
  (this->hb_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_delayed_task;
  (this->hb_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_40._M_pi;
  (this->last_sent_timer_).t_created_.__d.__r = 0;
  (this->last_sent_timer_).duration_us_ = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->snp_sync_ctx_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->snp_sync_ctx_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->snp_sync_ctx_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->snp_sync_ctx_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->snp_sync_ctx_lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->snp_sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->last_sent_timer_).first_event_fired_ = true;
  (this->last_sent_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_sent_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->last_sent_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_sent_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_sent_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->last_sent_timer_);
  (this->last_resp_timer_).t_created_.__d.__r = 0;
  (this->last_resp_timer_).duration_us_ = 0;
  (this->last_resp_timer_).first_event_fired_ = true;
  (this->last_resp_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_resp_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->last_resp_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_resp_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_resp_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->last_resp_timer_);
  (this->last_active_timer_).t_created_.__d.__r = 0;
  (this->last_active_timer_).duration_us_ = 0;
  (this->last_active_timer_).first_event_fired_ = true;
  (this->last_active_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_active_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->last_active_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_active_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_active_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->last_active_timer_);
  (this->hb_cnt_since_leave_).super___atomic_base<int>._M_i = 0;
  this->stepping_down_ = (__atomic_base<bool>)0x0;
  this->reconn_scheduled_ = (__atomic_base<bool>)0x0;
  this->long_pause_warnings_ = (__atomic_base<int>)0x0;
  this->network_recoveries_ = (__atomic_base<int>)0x0;
  (this->manual_free_)._M_base._M_i = false;
  *(undefined8 *)&this->rpc_errs_ = 0;
  *(undefined8 *)((long)&(this->last_sent_idx_).super___atomic_base<unsigned_long>._M_i + 4) = 0;
  (this->leave_requested_)._M_base._M_i = false;
  (this->reconn_timer_).t_created_.__d.__r = 0;
  (this->reconn_timer_).duration_us_ = 0;
  (this->reconn_timer_).first_event_fired_ = true;
  (this->reconn_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->reconn_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->reconn_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->reconn_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->reconn_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->reconn_timer_);
  (this->reconn_backoff_).t_created_.__d.__r = 0;
  (this->reconn_backoff_).duration_us_ = 0;
  (this->reconn_backoff_).first_event_fired_ = true;
  (this->reconn_backoff_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->reconn_backoff_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->reconn_backoff_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->reconn_backoff_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->reconn_backoff_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->reconn_backoff_);
  this->suppress_following_error_ = (__atomic_base<bool>)0x0;
  this->abandoned_ = (__atomic_base<bool>)0x0;
  (this->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this->rsv_msg_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->rsv_msg_handler_).super__Function_base._M_functor + 8) = 0;
  (this->rsv_msg_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->rsv_msg_handler_)._M_invoker = (_Invoker_type)0x0;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (logger->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  timer_helper::reset(&this->last_sent_timer_);
  timer_helper::reset(&this->last_resp_timer_);
  timer_helper::reset(&this->last_active_timer_);
  return;
}

Assistant:

peer( ptr<srv_config>& config,
          const context& ctx,
          timer_task<int32>::executor& hb_exec,
          ptr<logger>& logger )
        : config_(config)
        , scheduler_(ctx.scheduler_)
        , rpc_( ctx.rpc_cli_factory_->create_client(config->get_endpoint()) )
        , current_hb_interval_( ctx.get_params()->heart_beat_interval_ )
        , hb_interval_( ctx.get_params()->heart_beat_interval_ )
        , rpc_backoff_( ctx.get_params()->rpc_failure_backoff_ )
        , max_hb_interval_( ctx.get_params()->max_hb_interval() )
        , next_log_idx_(0)
        , last_accepted_log_idx_(0)
        , next_batch_size_hint_in_bytes_(0)
        , matched_idx_(0)
        , busy_flag_(false)
        , pending_commit_flag_(false)
        , hb_enabled_(false)
        , hb_task_( cs_new< timer_task<int32>,
                            timer_task<int32>::executor&,
                            int32 >
                          ( hb_exec, config->get_id(),
                            timer_task_type::heartbeat_timer ) )
        , snp_sync_ctx_(nullptr)
        , lock_()
        , long_pause_warnings_(0)
        , network_recoveries_(0)
        , manual_free_(false)
        , rpc_errs_(0)
        , last_sent_idx_(0)
        , cnt_not_applied_(0)
        , leave_requested_(false)
        , hb_cnt_since_leave_(0)
        , stepping_down_(false)
        , reconn_scheduled_(false)
        , reconn_backoff_(0)
        , suppress_following_error_(false)
        , abandoned_(false)
        , rsv_msg_(nullptr)
        , rsv_msg_handler_(nullptr)
        , l_(logger)
    {
        reset_ls_timer();
        reset_resp_timer();
        reset_active_timer();
    }